

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matmul.c
# Opt level: O1

void gai_matmul_patch(char *transa,char *transb,void *alpha,void *beta,Integer g_a,Integer *alo,
                     Integer *ahi,int avec_pos,Integer g_b,Integer *blo,Integer *bhi,int bvec_pos,
                     Integer g_c,Integer *clo,Integer *chi)

{
  size_t sVar1;
  long lVar2;
  int iVar3;
  byte *pbVar4;
  Integer IVar5;
  Integer IVar6;
  logical lVar7;
  logical lVar8;
  long lVar9;
  long lVar10;
  double *pdVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  undefined8 *alpha_00;
  void *__s;
  Integer IVar20;
  bool bVar21;
  bool bVar22;
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  long local_408;
  int cjpos;
  int cipos;
  int bjpos;
  int bipos;
  int ajpos;
  int aipos;
  Integer local_3e8;
  Integer local_3e0;
  long local_3d8;
  Integer ajlo;
  Integer ailo;
  long local_3c0;
  Integer local_3b8;
  byte *local_3b0;
  Integer bjlo;
  Integer bilo;
  Integer ajhi;
  Integer aihi;
  Integer atype;
  void *local_380;
  byte *local_378;
  Integer cjlo;
  Integer bjhi;
  Integer bihi;
  Integer *local_358;
  Integer cjhi;
  Integer cihi;
  Integer cilo;
  void *local_338;
  void *local_330;
  void *local_328;
  double *local_320;
  double *local_318;
  double *local_310;
  Integer bdim2;
  Integer bdim1;
  Integer adim2;
  Integer adim1;
  long cdim_t;
  long bdim_t;
  long adim_t;
  long kdim_t;
  long jdim_t;
  long idim_t;
  undefined8 local_2b8;
  Integer cdim2;
  Integer cdim1;
  long local_2a0;
  Integer crank;
  Integer brank;
  int local_288;
  int cvpos;
  int bvpos;
  int avpos;
  long local_278;
  long local_270;
  long local_268;
  Integer local_260;
  long local_258;
  long local_250;
  double *local_248;
  long local_240;
  double *local_238;
  Integer arank;
  Integer bdims [7];
  Integer adims [7];
  Integer tmpld [7];
  undefined8 local_168;
  undefined8 uStack_160;
  Integer local_158;
  Integer local_150;
  long local_148;
  long local_140;
  Integer local_138;
  Integer local_130;
  long local_128;
  long local_120;
  long local_118;
  long local_110;
  long local_108;
  long local_100;
  long local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  long local_d8;
  Integer local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  Integer local_b0;
  Integer local_a8;
  Integer local_a0;
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  Integer ctype;
  Integer btype;
  Integer cdims [7];
  
  local_3b8 = g_a;
  local_3b0 = (byte *)transb;
  local_378 = (byte *)transa;
  local_358 = alo;
  local_338 = alpha;
  IVar5 = pnga_nodeid();
  iVar3 = _ga_sync_end;
  local_168 = 0x3ff0000000000000;
  uStack_160 = 0;
  local_2b8 = 0x3f800000;
  bVar21 = _ga_sync_begin != 0;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (bVar21) {
    pnga_sync();
  }
  IVar6 = pnga_total_blocks(local_3b8);
  if (((0 < IVar6) || (IVar6 = pnga_total_blocks(g_b), 0 < IVar6)) ||
     (IVar6 = pnga_total_blocks(g_c), 0 < IVar6)) {
    pnga_matmul_basic((char *)local_378,(char *)local_3b0,local_338,beta,local_3b8,local_358,ahi,g_b
                      ,blo,bhi,g_c,clo,chi);
    return;
  }
  local_310 = (double *)beta;
  lVar7 = pnga_is_mirrored(local_3b8);
  lVar8 = pnga_is_mirrored(g_b);
  if (lVar7 == lVar8) {
    lVar7 = pnga_is_mirrored(local_3b8);
    lVar8 = pnga_is_mirrored(g_c);
    if (lVar7 != lVar8) goto LAB_00126632;
  }
  else {
LAB_00126632:
    IVar6 = pnga_nnodes();
    pnga_error("Processors do not match for all arrays",IVar6);
  }
  lVar7 = pnga_is_mirrored(local_3b8);
  if (lVar7 == 0) {
    local_3e8 = pnga_nnodes();
  }
  else {
    IVar6 = pnga_cluster_nodeid();
    local_3e8 = pnga_cluster_nprocs(IVar6);
    IVar6 = pnga_cluster_procid(IVar6,0);
    IVar5 = IVar5 - IVar6;
  }
  pnga_inquire(local_3b8,&atype,&arank,adims);
  pnga_inquire(g_b,&btype,&brank,bdims);
  pnga_inquire(g_c,&ctype,&crank,cdims);
  if (arank < 2) {
    pnga_error("rank of A must be at least 2",arank);
  }
  if (brank < 2) {
    pnga_error("rank of B must be at least 2",brank);
  }
  if (crank < 2) {
    pnga_error("rank of C must be at least 2",crank);
  }
  if ((CONCAT44(atype._4_4_,(int)atype) != btype) || (CONCAT44(atype._4_4_,(int)atype) != ctype)) {
    pnga_error(" types mismatch ",0);
  }
  local_288 = iVar3;
  uVar14 = CONCAT44(atype._4_4_,(int)atype) - 0x3eb;
  local_3e0 = IVar5;
  if ((4 < uVar14) || (uVar14 == 2)) {
    pnga_error(" type error",CONCAT44(atype._4_4_,(int)atype));
  }
  pbVar4 = local_378;
  gai_setup_2d_patch(arank,(char *)local_378,adims,local_358,ahi,&ailo,&aihi,&ajlo,&ajhi,&adim1,
                     &adim2,&aipos,&ajpos,&avpos,avec_pos);
  gai_setup_2d_patch(brank,(char *)local_3b0,bdims,blo,bhi,&bilo,&bihi,&bjlo,&bjhi,&bdim1,&bdim2,
                     &bipos,&bjpos,&bvpos,bvec_pos);
  gai_setup_2d_patch(crank,(char *)0x0,cdims,clo,chi,&cilo,&cihi,&cjlo,&cjhi,&cdim1,&cdim2,&cipos,
                     &cjpos,&cvpos,-1);
  if ((*pbVar4 | 0x20) == 0x6e) {
    if (((ailo < 1) || (adim1 < aihi)) || (lVar10 = adim2, ajlo < 1)) goto LAB_001269a7;
joined_r0x001269a5:
    if (lVar10 < ajhi) goto LAB_001269a7;
  }
  else {
    if (((0 < ailo) && (aihi <= adim2)) && (lVar10 = adim1, 0 < ajlo)) goto joined_r0x001269a5;
LAB_001269a7:
    pnga_error("  g_a indices out of range ",local_3b8);
  }
  if ((*local_3b0 | 0x20) == 0x6e) {
    if (((bilo < 1) || (bdim1 < bihi)) || (lVar10 = bdim2, bjlo < 1)) goto LAB_00126a32;
joined_r0x00126a30:
    if (lVar10 < bjhi) goto LAB_00126a32;
  }
  else {
    if (((0 < bilo) && (bihi <= bdim2)) && (lVar10 = bdim1, 0 < bjlo)) goto joined_r0x00126a30;
LAB_00126a32:
    pnga_error("  g_b indices out of range ",g_b);
  }
  IVar5 = cilo;
  if (((cilo < 1) || (cdim1 < cihi)) || ((cjlo < 1 || (cdim2 < cjhi)))) {
    pnga_error("  g_c indices out of range ",g_c);
  }
  IVar20 = local_3e0;
  IVar6 = local_3e8;
  lVar15 = aihi - ailo;
  lVar18 = ajhi - ajlo;
  lVar19 = bihi - bilo;
  lVar10 = lVar15 + 1;
  lVar9 = bjhi - bjlo;
  lVar13 = lVar18 + 1;
  local_408 = lVar9 + 1;
  lVar17 = cihi - IVar5;
  lVar12 = cjhi - cjlo;
  if (((lVar15 != lVar17) || (lVar18 != lVar19)) || (lVar9 != lVar12)) {
    if (cvpos < 0 && (-1 >= bvpos && avpos >= 0)) {
      lVar10 = (long)aipos;
      aipos = aipos + -1;
      lVar13 = (long)ajpos;
      ajpos = ajpos + -1;
      ailo = local_358[lVar10 + -1];
      aihi = ahi[lVar10 + -1];
      ajlo = local_358[lVar13 + -1];
      ajhi = ahi[lVar13 + -1];
      adim1 = adims[lVar10 + -1];
      adim2 = adims[lVar13 + -1];
      lVar10 = (aihi - ailo) + 1;
      lVar13 = (ajhi - ajlo) + 1;
    }
    else {
      local_3d8 = lVar10;
      if (-1 < cvpos || (bvpos < 0 || -1 < avpos)) {
        if (cvpos < 0 || -1 < (avpos & bvpos)) {
          bVar21 = -1 < (avpos | bvpos);
          if (cvpos < 0 && bVar21) {
            if (lVar15 != lVar17) {
              lVar10 = (long)aipos;
              aipos = aipos + -1;
              lVar13 = (long)ajpos;
              ajpos = ajpos + -1;
              ailo = local_358[lVar10 + -1];
              aihi = ahi[lVar10 + -1];
              ajlo = local_358[lVar13 + -1];
              ajhi = ahi[lVar13 + -1];
              adim1 = adims[lVar10 + -1];
              adim2 = adims[lVar13 + -1];
              lVar10 = (aihi - ailo) + 1;
              lVar13 = (ajhi - ajlo) + 1;
            }
            if (lVar9 != lVar12) {
              lVar10 = (long)bipos;
              bipos = bipos + -1;
              lVar13 = (long)bjpos;
              bjpos = bjpos + -1;
              bilo = blo[lVar10 + -1];
              bihi = bhi[lVar10 + -1];
              bjlo = blo[lVar13 + -1];
              bjhi = bhi[lVar13 + -1];
              bdim1 = bdims[lVar10 + -1];
              bdim2 = bdims[lVar13 + -1];
              lVar13 = (ajhi - ajlo) + 1;
              local_408 = bjhi - bjlo;
              lVar10 = (aihi - ailo) + 1;
LAB_00127e23:
              local_408 = local_408 + 1;
            }
          }
          else if ((-1 < bvpos || avpos < 0) || cvpos < 0) {
            if ((bvpos < 0 || -1 < avpos) || cvpos < 0) {
              if (bVar21 && -1 < cvpos) {
                pnga_error("a and b and c ambiguous",1);
              }
            }
            else {
              if (lVar18 != lVar19) {
                lVar9 = (long)bipos;
                bipos = bipos + -1;
                lVar12 = (long)bjpos;
                bjpos = bjpos + -1;
                bilo = blo[lVar9 + -1];
                bihi = bhi[lVar9 + -1];
                bjlo = blo[lVar12 + -1];
                bjhi = bhi[lVar12 + -1];
                bdim1 = bdims[lVar9 + -1];
                bdim2 = bdims[lVar12 + -1];
                local_408 = (bjhi - bjlo) + 1;
              }
              if (lVar15 != lVar17) {
                lVar9 = (long)cipos;
                cipos = cipos + -1;
                lVar12 = (long)cjpos;
                cjpos = cjpos + -1;
                cilo = clo[lVar9 + -1];
                cihi = chi[lVar9 + -1];
                cjlo = clo[lVar12 + -1];
                cjhi = chi[lVar12 + -1];
                cdim1 = cdims[lVar9 + -1];
                cdim2 = cdims[lVar12 + -1];
                local_408 = bjhi - bjlo;
                goto LAB_00127e23;
              }
            }
          }
          else {
            if (lVar18 != lVar19) {
              lVar10 = (long)aipos;
              aipos = aipos + -1;
              lVar13 = (long)ajpos;
              ajpos = ajpos + -1;
              ailo = local_358[lVar10 + -1];
              aihi = ahi[lVar10 + -1];
              ajlo = local_358[lVar13 + -1];
              ajhi = ahi[lVar13 + -1];
              adim1 = adims[lVar10 + -1];
              adim2 = adims[lVar13 + -1];
              lVar10 = (aihi - ailo) + 1;
              lVar13 = (ajhi - ajlo) + 1;
            }
            if (lVar9 != lVar12) {
              lVar10 = (long)cipos;
              cipos = cipos + -1;
              lVar13 = (long)cjpos;
              cjpos = cjpos + -1;
              cilo = clo[lVar10 + -1];
              cihi = chi[lVar10 + -1];
              cjlo = clo[lVar13 + -1];
              cjhi = chi[lVar13 + -1];
              cdim1 = cdims[lVar10 + -1];
              cdim2 = cdims[lVar13 + -1];
              lVar13 = (ajhi - ajlo) + 1;
              lVar10 = (aihi - ailo) + 1;
            }
          }
        }
        else {
          lVar9 = (long)cipos;
          cipos = cipos + -1;
          lVar12 = (long)cjpos;
          cjpos = cjpos + -1;
          cilo = clo[lVar9 + -1];
          cihi = chi[lVar9 + -1];
          cjlo = clo[lVar12 + -1];
          cjhi = chi[lVar12 + -1];
          cdim1 = cdims[lVar9 + -1];
          cdim2 = cdims[lVar12 + -1];
        }
      }
      else {
        lVar9 = (long)bipos;
        bipos = bipos + -1;
        lVar12 = (long)bjpos;
        bjpos = bjpos + -1;
        bilo = blo[lVar9 + -1];
        bihi = bhi[lVar9 + -1];
        bjlo = blo[lVar12 + -1];
        bjhi = bhi[lVar12 + -1];
        bdim1 = bdims[lVar9 + -1];
        bdim2 = bdims[lVar12 + -1];
        local_408 = (bjhi - bjlo) + 1;
      }
    }
  }
  local_3c0 = lVar13;
  if ((cihi - cilo) + 1 != lVar10) {
    pnga_error(" a & c dims error",lVar10);
  }
  if ((cjhi - cjlo) + 1 != local_408) {
    pnga_error(" b & c dims error",local_408);
  }
  if ((bihi - bilo) + 1 != local_3c0) {
    pnga_error(" a & b dims error",local_3c0);
  }
  local_3d8 = lVar10;
  dVar23 = pow(((double)(lVar10 * local_408) * (double)local_3c0) / (double)(IVar6 * 10),
               0.3333333333333333);
  lVar13 = (long)dVar23;
  lVar10 = 0x20;
  if (0x20 < lVar13) {
    lVar10 = lVar13;
  }
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)(BYTE_ARRAY_001d64d1 + CONCAT44(atype._4_4_,(int)atype) * 0x10 + 7);
  pdVar11 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x10)) / auVar29,0);
  if (lVar13 < 0x101) {
    lVar13 = (long)pdVar11 * 4 + 0x30000;
    lVar9 = 0x100;
    lVar12 = 0x100;
    lVar10 = 0x100;
  }
  else {
    local_318 = pdVar11;
    tmpld[0] = pnga_memory_avail_type(CONCAT44(atype._4_4_,(int)atype));
    IVar5 = pnga_type_f2c(0x3f2);
    pnga_gop(IVar5,tmpld,1,"min");
    if ((tmpld[0] < 0x40) && (IVar5 = pnga_nodeid(), IVar5 == 0)) {
      pnga_error("Not enough memory",tmpld[0]);
    }
    lVar13 = (long)((double)tmpld[0] * 0.9);
    pdVar11 = (double *)(double)((lVar13 + -4) / 3);
    if ((double)pdVar11 < 0.0) {
      local_320 = pdVar11;
      dVar23 = sqrt((double)pdVar11);
      pdVar11 = local_320;
    }
    else {
      dVar23 = SQRT((double)pdVar11);
    }
    if ((long)dVar23 < lVar10) {
      if ((double)pdVar11 < 0.0) {
        dVar23 = sqrt((double)pdVar11);
      }
      else {
        dVar23 = SQRT((double)pdVar11);
      }
      lVar10 = (long)dVar23;
    }
    lVar9 = lVar10;
    if (local_3d8 < lVar10) {
      lVar9 = local_3d8;
    }
    lVar12 = lVar10;
    if (local_408 < lVar10) {
      lVar12 = local_408;
    }
    pdVar11 = local_318;
    if (local_3c0 < lVar10) {
      lVar10 = local_3c0;
    }
  }
  local_380 = pnga_malloc(lVar13,(int)atype,"GA mulmat bufs");
  lVar15 = local_3d8;
  lVar13 = CONCAT44(atype._4_4_,(int)atype);
  local_148 = lVar12;
  local_128 = lVar10;
  if (lVar13 == 0x3ec) {
    bVar21 = NAN(*local_310);
    bVar22 = *local_310 == 0.0;
LAB_0012708e:
    if ((bVar22) && (!bVar21)) {
      pnga_fill_patch(g_c,clo,chi,local_310);
      goto LAB_001270ce;
    }
  }
  else {
    if (lVar13 != 0x3ee) {
      if (lVar13 == 0x3ef) {
        if ((*local_310 != 0.0) || (NAN(*local_310))) goto LAB_001270b1;
        bVar21 = NAN(local_310[1]);
        bVar22 = local_310[1] == 0.0;
      }
      else {
        bVar21 = NAN(*(float *)local_310);
        bVar22 = *(float *)local_310 == 0.0;
      }
      goto LAB_0012708e;
    }
    if ((*(float *)local_310 == 0.0) && (!NAN(*(float *)local_310))) {
      bVar21 = NAN(*(float *)((long)local_310 + 4));
      bVar22 = *(float *)((long)local_310 + 4) == 0.0;
      goto LAB_0012708e;
    }
  }
LAB_001270b1:
  pnga_scale_patch(g_c,clo,chi,local_310);
LAB_001270ce:
  if (0 < local_408) {
    lVar13 = ((lVar10 * lVar9) / (long)pdVar11) * 0x10;
    local_328 = (void *)((long)local_380 + lVar13 + 0x10);
    __s = (void *)((long)local_380 + ((lVar12 * lVar10) / (long)pdVar11) * 0x10 + 0x20 + lVar13);
    local_260 = ailo;
    local_130 = ajlo;
    local_c0 = (long)aipos;
    local_c8 = (long)ajpos;
    local_138 = bilo;
    local_150 = bjlo;
    local_100 = (long)bipos;
    local_108 = (long)bjpos;
    local_d0 = cilo;
    local_158 = cjlo;
    local_d8 = (long)cipos;
    local_e0 = (long)cjpos;
    local_278 = 0;
    lVar13 = 0;
    local_140 = 0;
    lVar10 = local_3c0;
    local_330 = __s;
    local_b8 = lVar9;
    do {
      lVar12 = local_140 + local_148;
      lVar17 = lVar12;
      if (local_408 < lVar12) {
        lVar17 = local_408;
      }
      if (0 < lVar10) {
        lVar17 = lVar17 + -1;
        local_318 = (double *)((lVar17 - local_140) + 1);
        local_118 = local_140 + local_148;
        if (local_408 < local_140 + local_148) {
          local_118 = local_408;
        }
        local_118 = local_118 - local_148 * local_278;
        local_268 = local_150 + local_140;
        local_270 = local_150 + lVar17;
        local_a0 = local_140 + local_158;
        local_a8 = lVar17 + local_158;
        local_b0 = (local_a8 - local_a0) + 1;
        local_e8 = local_118 * 8;
        local_120 = local_118 * 4;
        local_118 = local_118 * 0x10;
        local_110 = 0;
        local_140 = lVar12;
        do {
          lVar17 = local_128 + local_110;
          lVar12 = lVar17;
          if (lVar10 < lVar17) {
            lVar12 = lVar10;
          }
          if (0 < lVar15) {
            lVar12 = lVar12 + -1;
            local_320 = (double *)((lVar12 - local_110) + 1);
            local_250 = local_130 + local_110;
            local_258 = local_130 + lVar12;
            local_f0 = local_110 + local_138;
            local_f8 = lVar12 + local_138;
            lVar18 = 1;
            lVar10 = 0;
            lVar12 = 0;
            local_110 = lVar17;
            do {
              lVar19 = lVar9 + lVar12;
              lVar17 = lVar19;
              if (lVar15 < lVar19) {
                lVar17 = lVar15;
              }
              if (lVar13 % IVar6 == IVar20) {
                lVar16 = lVar9 + lVar12;
                if (lVar15 < lVar9 + lVar12) {
                  lVar16 = lVar15;
                }
                lVar16 = lVar16 + -1;
                local_310 = (double *)((lVar16 - lVar12) + 1);
                lVar15 = CONCAT44(atype._4_4_,(int)atype);
                lVar2 = local_120;
                if (((lVar15 != 0x3eb) && (lVar2 = local_e8, lVar15 != 0x3ec)) && (lVar15 != 0x3ee))
                {
                  lVar2 = local_118;
                }
                local_2a0 = lVar18;
                local_90 = lVar19;
                local_88 = lVar10;
                local_80 = lVar13;
                if (0 < (long)local_310 * (long)local_318) {
                  memset(__s,0,lVar2 * (lVar17 - lVar9 * lVar10));
                }
                IVar5 = arank;
                if ((*local_378 | 0x20) == 0x6e) {
                  local_238 = local_310;
                  local_240 = local_250;
                  lVar13 = local_260 + lVar16;
                  lVar10 = local_258;
                  lVar9 = local_260 + lVar12;
                }
                else {
                  local_240 = local_260 + lVar12;
                  lVar10 = local_260 + lVar16;
                  local_238 = local_320;
                  lVar13 = local_258;
                  lVar9 = local_250;
                }
                sVar1 = arank * 8;
                local_98 = lVar12;
                memcpy(adims,local_358,sVar1);
                memcpy(bdims,ahi,sVar1);
                if (1 < IVar5) {
                  lVar12 = IVar5 + -2;
                  auVar24._8_4_ = (int)lVar12;
                  auVar24._0_8_ = lVar12;
                  auVar24._12_4_ = (int)((ulong)lVar12 >> 0x20);
                  auVar24 = auVar24 ^ _DAT_001b2410;
                  uVar14 = 0;
                  auVar30 = _DAT_001b2440;
                  do {
                    auVar29 = auVar30 ^ _DAT_001b2410;
                    if ((bool)(~(auVar24._4_4_ < auVar29._4_4_ ||
                                auVar24._0_4_ < auVar29._0_4_ && auVar29._4_4_ == auVar24._4_4_) & 1
                              )) {
                      tmpld[uVar14] = 1;
                    }
                    if (auVar29._12_4_ <= auVar24._12_4_ &&
                        (auVar29._8_4_ <= auVar24._8_4_ || auVar29._12_4_ != auVar24._12_4_)) {
                      tmpld[uVar14 + 1] = 1;
                    }
                    uVar14 = uVar14 + 2;
                    lVar12 = auVar30._8_8_;
                    auVar30._0_8_ = auVar30._0_8_ + 2;
                    auVar30._8_8_ = lVar12 + 2;
                  } while ((IVar5 & 0x7ffffffffffffffeU) != uVar14);
                }
                lVar15 = local_c0;
                adims[local_c0] = lVar9;
                bdims[lVar15] = lVar13;
                lVar12 = local_c8;
                adims[local_c8] = local_240;
                bdims[lVar12] = lVar10;
                tmpld[lVar15] = (lVar13 - lVar9) + 1;
                tmpld[lVar12] = (lVar10 - local_240) + 1;
                pnga_get(local_3b8,adims,bdims,local_380,tmpld);
                IVar5 = brank;
                if (local_2a0 != 0) {
                  local_248 = local_320;
                  lVar10 = local_f0;
                  lVar13 = local_f8;
                  lVar9 = local_270;
                  lVar12 = local_268;
                  if ((*local_3b0 | 0x20) != 0x6e) {
                    local_248 = local_318;
                    lVar10 = local_268;
                    lVar13 = local_270;
                    lVar9 = local_f8;
                    lVar12 = local_f0;
                  }
                  sVar1 = brank * 8;
                  local_2a0 = lVar16;
                  memcpy(adims,blo,sVar1);
                  memcpy(bdims,bhi,sVar1);
                  lVar16 = local_2a0;
                  if (1 < IVar5) {
                    lVar15 = IVar5 + -2;
                    auVar25._8_4_ = (int)lVar15;
                    auVar25._0_8_ = lVar15;
                    auVar25._12_4_ = (int)((ulong)lVar15 >> 0x20);
                    uVar14 = 0;
                    auVar27 = _DAT_001b2440;
                    do {
                      auVar29 = auVar25 ^ _DAT_001b2410;
                      auVar30 = auVar27 ^ _DAT_001b2410;
                      if ((bool)(~(auVar30._4_4_ == auVar29._4_4_ && auVar29._0_4_ < auVar30._0_4_
                                  || auVar29._4_4_ < auVar30._4_4_) & 1)) {
                        tmpld[uVar14] = 1;
                      }
                      if (auVar30._12_4_ <= auVar29._12_4_ &&
                          (auVar30._12_4_ != auVar29._12_4_ || auVar30._8_4_ <= auVar29._8_4_)) {
                        tmpld[uVar14 + 1] = 1;
                      }
                      uVar14 = uVar14 + 2;
                      lVar15 = auVar27._8_8_;
                      auVar27._0_8_ = auVar27._0_8_ + 2;
                      auVar27._8_8_ = lVar15 + 2;
                    } while ((IVar5 & 0x7ffffffffffffffeU) != uVar14);
                  }
                  lVar17 = local_100;
                  adims[local_100] = lVar10;
                  bdims[lVar17] = lVar13;
                  lVar15 = local_108;
                  adims[local_108] = lVar12;
                  bdims[lVar15] = lVar9;
                  tmpld[lVar17] = (lVar13 - lVar10) + 1;
                  tmpld[lVar15] = (lVar9 - lVar12) + 1;
                  pnga_get(g_b,adims,bdims,local_328,tmpld);
                }
                __s = local_330;
                idim_t = (long)local_310;
                jdim_t = (long)local_318;
                kdim_t = (long)local_320;
                adim_t = (long)local_238;
                bdim_t = (long)local_248;
                cdim_t = (long)local_310;
                switch(CONCAT44(atype._4_4_,(int)atype)) {
                case 0x3eb:
                  gal_sgemm_(local_378,local_3b0,&idim_t,&jdim_t,&kdim_t,local_338,local_380,&adim_t
                             ,local_328,&bdim_t,&local_2b8,local_330,&cdim_t,1,1);
                  break;
                case 0x3ec:
                  gal_dgemm_(local_378,local_3b0,&idim_t,&jdim_t,&kdim_t,local_338,local_380,&adim_t
                             ,local_328,&bdim_t,&local_168,local_330,&cdim_t,1,1);
                  break;
                default:
                  pnga_error("ga_matmul_patch: wrong data type",CONCAT44(atype._4_4_,(int)atype));
                  __s = local_330;
                  break;
                case 0x3ee:
                  gal_cgemm_(local_378,local_3b0,&idim_t,&jdim_t,&kdim_t,local_338,local_380,&adim_t
                             ,local_328,&bdim_t,&local_2b8,local_330,&cdim_t,1,1);
                  break;
                case 0x3ef:
                  gal_zgemm_(local_378,local_3b0,&idim_t,&jdim_t,&kdim_t,local_338,local_380,&adim_t
                             ,local_328,&bdim_t,&local_168,local_330,&cdim_t,1,1);
                }
                IVar5 = crank;
                IVar20 = local_3e0;
                IVar6 = local_3e8;
                sVar1 = crank * 8;
                memcpy(adims,clo,sVar1);
                memcpy(bdims,chi,sVar1);
                lVar15 = local_3d8;
                if (1 < IVar5) {
                  lVar10 = IVar5 + -2;
                  auVar26._8_4_ = (int)lVar10;
                  auVar26._0_8_ = lVar10;
                  auVar26._12_4_ = (int)((ulong)lVar10 >> 0x20);
                  auVar26 = auVar26 ^ _DAT_001b2410;
                  uVar14 = 0;
                  auVar28 = _DAT_001b2440;
                  do {
                    auVar29 = auVar28 ^ _DAT_001b2410;
                    if ((bool)(~(auVar26._4_4_ < auVar29._4_4_ ||
                                auVar26._0_4_ < auVar29._0_4_ && auVar29._4_4_ == auVar26._4_4_) & 1
                              )) {
                      tmpld[uVar14] = 1;
                    }
                    if (auVar29._12_4_ <= auVar26._12_4_ &&
                        (auVar29._8_4_ <= auVar26._8_4_ || auVar29._12_4_ != auVar26._12_4_)) {
                      tmpld[uVar14 + 1] = 1;
                    }
                    uVar14 = uVar14 + 2;
                    lVar10 = auVar28._8_8_;
                    auVar28._0_8_ = auVar28._0_8_ + 2;
                    auVar28._8_8_ = lVar10 + 2;
                  } while ((IVar5 & 0x7ffffffffffffffeU) != uVar14);
                }
                lVar13 = local_d8;
                lVar9 = local_98 + local_d0;
                lVar16 = lVar16 + local_d0;
                adims[local_d8] = lVar9;
                bdims[lVar13] = lVar16;
                lVar10 = local_e0;
                adims[local_e0] = local_a0;
                bdims[lVar10] = local_a8;
                tmpld[lVar13] = (lVar16 - lVar9) + 1;
                tmpld[lVar10] = local_b0;
                alpha_00 = &local_2b8;
                if ((CONCAT44(atype._4_4_,(int)atype) != 0x3eb) &&
                   (CONCAT44(atype._4_4_,(int)atype) != 0x3ee)) {
                  alpha_00 = &local_168;
                }
                pnga_acc(g_c,adims,bdims,__s,tmpld,alpha_00);
                lVar18 = 0;
                lVar9 = local_b8;
                lVar13 = local_80;
                lVar10 = local_88;
                lVar19 = local_90;
              }
              lVar13 = lVar13 + 1;
              lVar10 = lVar10 + 1;
              lVar12 = lVar19;
              lVar17 = local_110;
            } while (lVar19 < lVar15);
          }
          local_110 = lVar17;
          lVar10 = local_3c0;
          lVar12 = local_140;
        } while (local_110 < local_3c0);
      }
      local_140 = lVar12;
      local_278 = local_278 + 1;
    } while (local_140 < local_408);
  }
  pnga_free(local_380);
  if (local_288 != 0) {
    pnga_sync();
  }
  return;
}

Assistant:

void gai_matmul_patch(char *transa, char *transb, void *alpha, void *beta, 
    Integer g_a, Integer alo[], Integer ahi[], int avec_pos,
    Integer g_b, Integer blo[], Integer bhi[], int bvec_pos,
    Integer g_c, Integer clo[], Integer chi[])
{
#ifdef STATBUF
   DoubleComplex a[ICHUNK*KCHUNK], b[KCHUNK*JCHUNK], c[ICHUNK*JCHUNK];
#else
   DoubleComplex *a, *b, *c;
#endif
Integer atype, btype, ctype, adim1, adim2, bdim1, bdim2, cdim1, cdim2;
Integer me= pnga_nodeid(), nproc, inode, iproc;
Integer i, ijk = 0, i0, i1, j0, j1;
Integer ilo, ihi, idim, jlo, jhi, jdim, klo, khi, kdim;
Integer n, m, k, k2, cm, cn, adim, bdim, cdim, arank, brank, crank;
int aipos, ajpos, bipos, bjpos,cipos, cjpos, need_scaling=1;
int avpos, bvpos, cvpos;
Integer Ichunk, Kchunk, Jchunk;
Integer ailo, aihi, ajlo, ajhi;    /* 2d plane of g_a */
Integer bilo, bihi, bjlo, bjhi;    /* 2d plane of g_b */
Integer cilo, cihi, cjlo, cjhi;    /* 2d plane of g_c */
Integer adims[GA_MAX_DIM],bdims[GA_MAX_DIM],cdims[GA_MAX_DIM],tmpld[GA_MAX_DIM];
Integer *tmplo = adims, *tmphi =bdims; 
DoubleComplex ONE;
SingleComplex ONE_CF;
Integer ZERO_I = 0;
Integer get_new_B;
DoublePrecision chunk_cube;
Integer min_tasks = 10, max_chunk;
int local_sync_begin,local_sync_end;
BlasInt idim_t, jdim_t, kdim_t, adim_t, bdim_t, cdim_t;

   ONE.real =1.; ONE.imag =0.;
   ONE_CF.real =1.; ONE_CF.imag =0.;
   
   local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
   _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
   if(local_sync_begin)pnga_sync();

   if (pnga_total_blocks(g_a) > 0 || pnga_total_blocks(g_b) > 0 ||
       pnga_total_blocks(g_c) > 0) {
     pnga_matmul_basic(transa, transb, alpha, beta, g_a, alo, ahi,
         g_b, blo, bhi, g_c, clo, chi);
     return;
   }

   /* Check to make sure all global arrays are of the same type */
   if (!(pnga_is_mirrored(g_a) == pnga_is_mirrored(g_b) &&
        pnga_is_mirrored(g_a) == pnga_is_mirrored(g_c))) {
     pnga_error("Processors do not match for all arrays",pnga_nnodes());
   }
   if (pnga_is_mirrored(g_a)) {
     inode = pnga_cluster_nodeid();
     nproc = pnga_cluster_nprocs(inode);
     iproc = me - pnga_cluster_procid(inode, ZERO_I);
   } else {
     nproc = pnga_nnodes();
     iproc = me;
   }

   pnga_inquire(g_a, &atype, &arank, adims);
   pnga_inquire(g_b, &btype, &brank, bdims);
   pnga_inquire(g_c, &ctype, &crank, cdims);

   if(arank<2)  pnga_error("rank of A must be at least 2",arank);
   if(brank<2)  pnga_error("rank of B must be at least 2",brank);
   if(crank<2)  pnga_error("rank of C must be at least 2",crank);

   if(atype != btype || atype != ctype ) pnga_error(" types mismatch ", 0L);
   if(atype != C_DCPL && atype != C_DBL && atype != C_FLOAT && atype != C_SCPL)
     pnga_error(" type error",atype);
   
   gai_setup_2d_patch(arank, transa, adims, alo, ahi, &ailo, &aihi,
                      &ajlo, &ajhi, &adim1, &adim2, &aipos, &ajpos, &avpos, avec_pos);
   gai_setup_2d_patch(brank, transb, bdims, blo, bhi, &bilo, &bihi,
                      &bjlo, &bjhi, &bdim1, &bdim2, &bipos, &bjpos, &bvpos, bvec_pos);
   gai_setup_2d_patch(crank, NULL, cdims, clo, chi, &cilo, &cihi,
                      &cjlo, &cjhi, &cdim1, &cdim2, &cipos, &cjpos, &cvpos, -1);


   /* check if patch indices and dims match */
   if (*transa == 'n' || *transa == 'N'){
      if (ailo <= 0 || aihi > adim1 || ajlo <= 0 || ajhi > adim2)
         pnga_error("  g_a indices out of range ", g_a);
   }else
      if (ailo <= 0 || aihi > adim2 || ajlo <= 0 || ajhi > adim1)
         pnga_error("  g_a indices out of range ", g_a);

   if (*transb == 'n' || *transb == 'N'){
      if (bilo <= 0 || bihi > bdim1 || bjlo <= 0 || bjhi > bdim2)
          pnga_error("  g_b indices out of range ", g_b);
   }else
      if (bilo <= 0 || bihi > bdim2 || bjlo <= 0 || bjhi > bdim1)
          pnga_error("  g_b indices out of range ", g_b);


   if (cilo <= 0 || cihi > cdim1 || cjlo <= 0 || cjhi > cdim2)
       pnga_error("  g_c indices out of range ", g_c);

   /* verify if patch dimensions are consistent */
#define RESET() do {   \
   m = aihi - ailo +1; \
   k = ajhi - ajlo +1; \
   k2= bihi - bilo +1; \
   n = bjhi - bjlo +1; \
   cm= cihi - cilo +1; \
   cn= cjhi - cjlo +1; \
} while (0)
   RESET();
#define SHIFT(L,INC) do {      \
   L##ipos+=INC;               \
   L##jpos+=INC;               \
   L##ilo = L##lo[L##ipos];    \
   L##ihi = L##hi[L##ipos];    \
   L##jlo = L##lo[L##jpos];    \
   L##jhi = L##hi[L##jpos];    \
   L##dim1 = L##dims[L##ipos]; \
   L##dim2 = L##dims[L##jpos]; \
   RESET();                    \
} while (0)
   /* gai_setup_2d_patch may produce ambiguous vectors */
   if (!(m==cm && k==k2 && n==cn)) {
       /* patches don't agree */
       if (avpos>=0 && bvpos<0 && cvpos<0) {
           /* only A is an ambiguous vector */
           SHIFT(a,-1);
       }
       else if (avpos<0 && bvpos>=0 && cvpos<0) {
           /* only B is an ambiguous vector */
           SHIFT(b,-1);
       }
       else if (avpos<0 && bvpos<0 && cvpos>=0) {
           /* only C is an ambiguous vector */
           SHIFT(c,-1);
       }
       else if (avpos>=0 && bvpos>=0 && cvpos<0) {
           /* A and B are ambiguous vectors */
           if (m != cm) {
               SHIFT(a,-1);
           }
           if (n != cn) {
               SHIFT(b,-1);
           }
       }
       else if (avpos>=0 && bvpos<0 && cvpos>=0) {
           /* A and C are ambiguous vectors */
           if (k != k2) {
               SHIFT(a,-1);
           }
           if (n != cn) {
               SHIFT(c,-1);
           }
       }
       else if (avpos<0 && bvpos>=0 && cvpos>=0) {
           /* B and C are ambiguous vectors */
           if (k != k2) {
               SHIFT(b,-1);
           }
           if (m != cm) {
               SHIFT(c,-1);
           }
       }
       else if (avpos>=0 && bvpos>=0 && cvpos>=0) {
           /* A and B and C are ambiguous vectors */
           pnga_error("a and b and c ambiguous", 1);
       }
   }
   if( (cihi - cilo +1) != m) pnga_error(" a & c dims error",m);
   if( (cjhi - cjlo +1) != n) pnga_error(" b & c dims error",n);
   if( (bihi - bilo +1) != k) pnga_error(" a & b dims error",k);
   
   chunk_cube = (k*(double)(m*n)) / (min_tasks * nproc);
   max_chunk = (Integer)pow(chunk_cube, (DoublePrecision)(1.0/3.0) );
   if (max_chunk < 32) max_chunk = 32;
   
#ifdef STATBUF
   if(atype ==  C_DBL || atype == C_FLOAT){
      Ichunk=D_CHUNK, Kchunk=D_CHUNK, Jchunk=D_CHUNK;
   }else{
      Ichunk=ICHUNK; Kchunk=KCHUNK; Jchunk=JCHUNK;
   }
#else
   {
     Integer elems, factor = sizeof(DoubleComplex)/GAsizeofM(atype);
     Ichunk = Jchunk = Kchunk = CHUNK_SIZE;
     
     if ( max_chunk > Ichunk) {       
       /*if memory if very limited, performance degrades for large matrices
	 as chunk size is very small, which leads to communication overhead)*/
       Integer avail = pnga_memory_avail_type(atype);
       pnga_gop(pnga_type_f2c(MT_F_INT), &avail, (Integer)1, "min");
       if(avail<MINMEM && pnga_nodeid()==0) pnga_error("Not enough memory",avail);
       elems = (Integer)(avail*0.9);/* Donot use every last drop */
       
       max_chunk=GA_MIN(max_chunk, (Integer)(sqrt( (double)((elems-EXTRA)/3))));
       Ichunk = GA_MIN(m,max_chunk);
       Jchunk = GA_MIN(n,max_chunk);
       Kchunk = GA_MIN(k,max_chunk);
     }
     else /* "EXTRA" elems for safety - just in case */
       elems = 3*Ichunk*Jchunk + EXTRA*factor;

     a = (DoubleComplex*) pnga_malloc(elems, atype, "GA mulmat bufs");     
     b = a + (Ichunk*Kchunk)/factor + 1; 
     c = b + (Kchunk*Jchunk)/factor + 1;
   }
#endif

   if(atype==C_DCPL){if((((DoubleComplex*)beta)->real == 0) &&
	       (((DoubleComplex*)beta)->imag ==0)) need_scaling =0;} 
   else if(atype==C_SCPL){if((((SingleComplex*)beta)->real == 0) &&
	       (((SingleComplex*)beta)->imag ==0)) need_scaling =0;} 
   else if(atype==C_DBL){if(*(DoublePrecision *)beta == 0)need_scaling =0;}
   else if( *(float*)beta ==0) need_scaling =0;

   if(need_scaling) pnga_scale_patch(g_c, clo, chi, beta);
   else      pnga_fill_patch(g_c, clo, chi, beta);
  
   for(jlo = 0; jlo < n; jlo += Jchunk){ /* loop through columns of g_c patch */
       jhi = GA_MIN(n-1, jlo+Jchunk-1);
       jdim= jhi - jlo +1;
       
       for(klo = 0; klo < k; klo += Kchunk){    /* loop cols of g_a patch */
	 khi = GA_MIN(k-1, klo+Kchunk-1);        /* loop rows of g_b patch */
	 kdim= khi - klo +1;               

	 get_new_B = TRUE;
	 
	 for(ilo = 0; ilo < m; ilo += Ichunk){ /*loop through rows of g_c patch */
	   
	   if(ijk%nproc == iproc){
	     ihi = GA_MIN(m-1, ilo+Ichunk-1);
	     idim= cdim = ihi - ilo +1;
	     
	     if(atype == C_FLOAT) 
	       for (i = 0; i < idim*jdim; i++) *(((float*)c)+i)=0;
	     else if(atype ==  C_DBL)
	       for (i = 0; i < idim*jdim; i++) *(((double*)c)+i)=0;
	     else if(atype == C_SCPL)
	       for (i = 0; i < idim*jdim; i++){
                 ((SingleComplex*)c)[i].real=0;
                 ((SingleComplex*)c)[i].imag=0;
               }
             else
	       for (i = 0; i < idim*jdim; i++){ c[i].real=0;c[i].imag=0;}
	     
	     if (*transa == 'n' || *transa == 'N'){ 
	       adim = idim;
	       i0= ailo+ilo; i1= ailo+ihi;   
	       j0= ajlo+klo; j1= ajlo+khi;
	     }else{
	       adim = kdim;
	       i0= ajlo+klo; i1= ajlo+khi;   
	       j0= ailo+ilo; j1= ailo+ihi;
	     }

	     /* ga_get_(g_a, &i0, &i1, &j0, &j1, a, &adim); */
	     memcpy(tmplo,alo,arank*sizeof(Integer));
	     memcpy(tmphi,ahi,arank*sizeof(Integer));
	     SETINT(tmpld,1,arank-1);
	     tmplo[aipos]=i0; tmphi[aipos]=i1;
	     tmplo[ajpos]=j0; tmphi[ajpos]=j1;
	     tmpld[aipos]=i1-i0+1;
	     tmpld[ajpos]=j1-j0+1;
	     pnga_get(g_a,tmplo,tmphi,a,tmpld);
	     
	     if(get_new_B) {
	       if (*transb == 'n' || *transb == 'N'){ 
		 bdim = kdim;
		 i0= bilo+klo; i1= bilo+khi;   
		 j0= bjlo+jlo; j1= bjlo+jhi;
	       }else{
		 bdim = jdim;
		 i0= bjlo+jlo; i1= bjlo+jhi;   
		 j0= bilo+klo; j1= bilo+khi;
	       }
	       /* ga_get_(g_b, &i0, &i1, &j0, &j1, b, &bdim); */
	       memcpy(tmplo,blo,brank*sizeof(Integer));
	       memcpy(tmphi,bhi,brank*sizeof(Integer));
	       SETINT(tmpld,1,brank-1);
	       tmplo[bipos]=i0; tmphi[bipos]=i1;
	       tmplo[bjpos]=j0; tmphi[bjpos]=j1;
	       tmpld[bipos]=i1-i0+1;
	       tmpld[bjpos]=j1-j0+1;
	       pnga_get(g_b,tmplo,tmphi,b,tmpld);
	       get_new_B = FALSE;
	     }

	     idim_t=idim; jdim_t=jdim; kdim_t=kdim;
	     adim_t=adim; bdim_t=bdim; cdim_t=cdim;

		  switch(atype) {
		  case C_FLOAT:
		    BLAS_SGEMM(transa, transb, &idim_t, &jdim_t, &kdim_t,
			   (Real *)alpha, (Real *)a, &adim_t,
               (Real *)b, &bdim_t, (Real *)&ONE_CF,
               (Real *)c, &cdim_t);
		    break;
		  case C_DBL:
		    BLAS_DGEMM(transa, transb, &idim_t, &jdim_t, &kdim_t,
			   (DoublePrecision *)alpha, (DoublePrecision *)a, &adim_t,
               (DoublePrecision *)b, &bdim_t, (DoublePrecision *)&ONE,
               (DoublePrecision *)c, &cdim_t);
		    break;
		  case C_DCPL:
		    BLAS_ZGEMM(transa, transb, &idim_t, &jdim_t, &kdim_t,
			   (DoubleComplex *)alpha, (DoubleComplex *)a, &adim_t,
               (DoubleComplex *)b, &bdim_t, (DoubleComplex *)&ONE,
               (DoubleComplex *)c, &cdim_t);
		    break;
		  case C_SCPL:
		    BLAS_CGEMM(transa, transb, &idim_t, &jdim_t, &kdim_t,
			   (SingleComplex *)alpha, (SingleComplex *)a, &adim_t,
               (SingleComplex *)b, &bdim_t, (SingleComplex *)&ONE_CF,
               (SingleComplex *)c, &cdim_t);
		    break;
		  default:
		    pnga_error("ga_matmul_patch: wrong data type", atype);
		  }

                  i0= cilo+ilo; i1= cilo+ihi;   j0= cjlo+jlo; j1= cjlo+jhi;
                  /* ga_acc_(g_c, &i0, &i1, &j0, &j1, (DoublePrecision*)c, 
                                            &cdim, (DoublePrecision*)&ONE); */
		  memcpy(tmplo,clo,crank*sizeof(Integer));
		  memcpy(tmphi,chi,crank*sizeof(Integer));
		  SETINT(tmpld,1,crank-1);
		  tmplo[cipos]=i0; tmphi[cipos]=i1;
		  tmplo[cjpos]=j0; tmphi[cjpos]=j1;
		  tmpld[cipos]=i1-i0+1;
		  tmpld[cjpos]=j1-j0+1;
		  if(atype == C_FLOAT || atype == C_SCPL) 
		    pnga_acc(g_c,tmplo,tmphi,(float *)c,tmpld, &ONE_CF);
		  else
		    pnga_acc(g_c,tmplo,tmphi,c,tmpld,(DoublePrecision*)&ONE);
               }
	   ++ijk;
	 }
       }
   }

#ifndef STATBUF
   pnga_free(a);
#endif
   
   if(local_sync_end)pnga_sync(); 
}